

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soap_device.c
# Opt level: O2

void send_error_response(SOCKINFO *info,int error_code,char *err_msg,http_message_t *hmsg)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int timeout_secs;
  SOCKINFO *local_88;
  int minor;
  int major;
  membuffer headers;
  char err_code_str [30];
  
  timeout_secs = 0x1e;
  err_code_str[0] = '\0';
  err_code_str[1] = '\0';
  err_code_str[2] = '\0';
  err_code_str[3] = '\0';
  err_code_str[4] = '\0';
  err_code_str[5] = '\0';
  err_code_str[6] = '\0';
  err_code_str[7] = '\0';
  err_code_str[8] = '\0';
  err_code_str[9] = '\0';
  err_code_str[10] = '\0';
  err_code_str[0xb] = '\0';
  err_code_str[0xc] = '\0';
  err_code_str[0xd] = '\0';
  err_code_str[0xe] = '\0';
  err_code_str[0xf] = '\0';
  err_code_str[0x10] = '\0';
  err_code_str[0x11] = '\0';
  err_code_str[0x12] = '\0';
  err_code_str[0x13] = '\0';
  err_code_str[0x14] = '\0';
  err_code_str[0x15] = '\0';
  err_code_str[0x16] = '\0';
  err_code_str[0x17] = '\0';
  err_code_str[0x18] = '\0';
  err_code_str[0x19] = '\0';
  err_code_str[0x1a] = '\0';
  err_code_str[0x1b] = '\0';
  err_code_str[0x1c] = '\0';
  err_code_str[0x1d] = '\0';
  local_88 = info;
  snprintf(err_code_str,0x1e,"%d",error_code);
  sVar2 = strlen(err_code_str);
  sVar3 = strlen(err_msg);
  http_CalcResponseVersion(hmsg->major_version,hmsg->minor_version,&major,&minor);
  membuffer_init(&headers);
  iVar1 = http_MakeMessage(&headers,major,minor,"RNsDsSXccsssss",500,sVar2 + sVar3 + 0x18b,
                           ContentTypeHeader,"EXT:\r\n","redsonic",
                           "<s:Envelope xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/\">\n<s:Body>\n<s:Fault>\n<faultcode>s:Client</faultcode>\n<faultstring>UPnPError</faultstring>\n<detail>\n<UPnPError xmlns=\"urn:schemas-upnp-org:control-1-0\">\n<errorCode>"
                           ,err_code_str,"</errorCode>\n<errorDescription>",err_msg,
                           "</errorDescription>\n</UPnPError>\n</detail>\n</s:Fault>\n</s:Body>\n</s:Envelope>\n"
                          );
  if (iVar1 == 0) {
    http_SendMessage(local_88,&timeout_secs,"b",headers.buf,headers.length);
  }
  membuffer_destroy(&headers);
  return;
}

Assistant:

static void send_error_response(
	/*! [in] Socket info. */
	SOCKINFO *info,
	/*! [in] Error code. */
	int error_code,
	/*! [in] Error message. */
	const char *err_msg,
	/*! [in] HTTP request. */
	http_message_t *hmsg)
{
	off_t content_length;
	int timeout_secs = SOAP_TIMEOUT;
	int major;
	int minor;
	const char *start_body =
		/*		"<?xml version=\"1.0\"?>\n" required?? */
		"<s:Envelope "
		"xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" "
		"s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/"
		"\">\n"
		"<s:Body>\n"
		"<s:Fault>\n"
		"<faultcode>s:Client</faultcode>\n"
		"<faultstring>UPnPError</faultstring>\n"
		"<detail>\n"
		"<UPnPError xmlns=\"urn:schemas-upnp-org:control-1-0\">\n"
		"<errorCode>";
	const char *mid_body = "</errorCode>\n"
			       "<errorDescription>";
	const char *end_body = "</errorDescription>\n"
			       "</UPnPError>\n"
			       "</detail>\n"
			       "</s:Fault>\n"
			       "</s:Body>\n"
			       "</s:Envelope>\n";
	char err_code_str[30];
	membuffer headers;

	memset(err_code_str, 0, sizeof(err_code_str));
	snprintf(err_code_str, sizeof(err_code_str), "%d", error_code);
	/* calc body len */
	content_length =
		(off_t)(strlen(start_body) + strlen(err_code_str) +
			strlen(mid_body) + strlen(err_msg) + strlen(end_body));
	http_CalcResponseVersion(
		hmsg->major_version, hmsg->minor_version, &major, &minor);
	/* make headers */
	membuffer_init(&headers);
	if (http_MakeMessage(&headers,
		    major,
		    minor,
		    "RNsDsSXcc"
		    "sssss",
		    500,
		    content_length,
		    ContentTypeHeader,
		    "EXT:\r\n",
		    X_USER_AGENT,
		    start_body,
		    err_code_str,
		    mid_body,
		    err_msg,
		    end_body) != 0) {
		membuffer_destroy(&headers);
		/* out of mem */
		return;
	}
	/* send err msg */
	http_SendMessage(info, &timeout_secs, "b", headers.buf, headers.length);
	membuffer_destroy(&headers);
}